

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_iterative.c
# Opt level: O1

int SUNQRsol(int n,sunrealtype **h,sunrealtype *q,sunrealtype *b)

{
  ulong uVar1;
  double *pdVar2;
  double dVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  double dVar11;
  sunrealtype sVar12;
  
  if (0 < n) {
    sVar12 = *b;
    lVar10 = 0;
    do {
      pdVar2 = (double *)((long)q + lVar10 * 2);
      dVar5 = *pdVar2;
      dVar6 = pdVar2[1];
      dVar3 = *(double *)((long)b + lVar10 + 8);
      dVar11 = sVar12 * dVar5;
      sVar12 = sVar12 * dVar6 + dVar5 * dVar3;
      *(double *)((long)b + lVar10) = dVar11 + -dVar6 * dVar3;
      ((double *)((long)b + lVar10))[1] = sVar12;
      lVar10 = lVar10 + 8;
    } while ((ulong)(uint)n * 8 - lVar10 != 0);
  }
  if (0 < n) {
    uVar9 = (ulong)(n - 1);
    uVar7 = (ulong)(uint)n;
    do {
      dVar3 = h[uVar7 - 1][uVar7 - 1];
      if ((dVar3 == 0.0) && (!NAN(dVar3))) goto LAB_0010be7d;
      uVar1 = uVar7 - 1;
      b[uVar1] = b[uVar1] / dVar3;
      if (1 < (long)uVar7) {
        uVar8 = 0;
        do {
          b[uVar8] = b[uVar8] - b[uVar1] * h[uVar8][uVar1];
          uVar8 = uVar8 + 1;
        } while (uVar9 != uVar8);
      }
      uVar9 = uVar9 - 1;
      bVar4 = 1 < (long)uVar7;
      uVar7 = uVar1;
    } while (bVar4);
  }
  uVar7 = 0;
LAB_0010be7d:
  return (int)uVar7;
}

Assistant:

int SUNQRsol(int n, sunrealtype** h, sunrealtype* q, sunrealtype* b)
{
  sunrealtype c, s, temp1, temp2;
  int i, k, q_ptr, code = 0;

  /* Compute Q*b */

  for (k = 0; k < n; k++)
  {
    q_ptr    = 2 * k;
    c        = q[q_ptr];
    s        = q[q_ptr + 1];
    temp1    = b[k];
    temp2    = b[k + 1];
    b[k]     = c * temp1 - s * temp2;
    b[k + 1] = s * temp1 + c * temp2;
  }

  /* Solve  R*x = Q*b */

  for (k = n - 1; k >= 0; k--)
  {
    if (h[k][k] == ZERO)
    {
      code = k + 1;
      break;
    }
    b[k] /= h[k][k];
    for (i = 0; i < k; i++) { b[i] -= b[k] * h[i][k]; }
  }

  return (code);
}